

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__write(uv_stream_t *stream)

{
  bool bVar1;
  int iVar2;
  uv__queue *puVar3;
  uv_write_t *req_00;
  size_t n_00;
  int local_2c;
  int count;
  ssize_t n;
  uv_write_t *req;
  uv__queue *q;
  uv_stream_t *stream_local;
  
  if ((stream->io_watcher).fd < 0) {
    __assert_fail("uv__stream_fd(stream) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                  ,0x34d,"void uv__write(uv_stream_t *)");
  }
  local_2c = 0x20;
  do {
    while( true ) {
      iVar2 = uv__queue_empty(&stream->write_queue);
      if (iVar2 != 0) {
        return;
      }
      puVar3 = uv__queue_head(&stream->write_queue);
      req_00 = (uv_write_t *)(puVar3 + -6);
      if ((uv_stream_t *)puVar3[-1].prev != stream) {
        __assert_fail("req->handle == stream",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/stream.c"
                      ,0x35b,"void uv__write(uv_stream_t *)");
      }
      iVar2 = uv__try_write(stream,(uv_buf_t *)(puVar3[1].prev + *(uint *)&puVar3[1].next),
                            *(int *)&puVar3[2].next - *(int *)&puVar3[1].next,
                            (uv_stream_t *)puVar3[-1].next);
      n_00 = (size_t)iVar2;
      if (-1 < (long)n_00) break;
      if (n_00 != 0xfffffffffffffff5) {
        *(int *)((long)&puVar3[2].next + 4) = iVar2;
        uv__write_req_finish(req_00);
        uv__io_stop(stream->loop,&stream->io_watcher,4);
        uv__stream_osx_interrupt_select(stream);
        return;
      }
LAB_00219341:
      if ((stream->flags & 0x100000) == 0) {
        uv__io_start(stream->loop,&stream->io_watcher,4);
        uv__stream_osx_interrupt_select(stream);
        return;
      }
    }
    puVar3[-1].next = (uv__queue *)0x0;
    iVar2 = uv__write_req_update(stream,req_00,n_00);
    if (iVar2 == 0) goto LAB_00219341;
    uv__write_req_finish(req_00);
    bVar1 = local_2c < 1;
    local_2c = local_2c + -1;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void uv__write(uv_stream_t* stream) {
  struct uv__queue* q;
  uv_write_t* req;
  ssize_t n;
  int count;

  assert(uv__stream_fd(stream) >= 0);

  /* Prevent loop starvation when the consumer of this stream read as fast as
   * (or faster than) we can write it. This `count` mechanism does not need to
   * change even if we switch to edge-triggered I/O.
   */
  count = 32;

  for (;;) {
    if (uv__queue_empty(&stream->write_queue))
      return;

    q = uv__queue_head(&stream->write_queue);
    req = uv__queue_data(q, uv_write_t, queue);
    assert(req->handle == stream);

    n = uv__try_write(stream,
                      &(req->bufs[req->write_index]),
                      req->nbufs - req->write_index,
                      req->send_handle);

    /* Ensure the handle isn't sent again in case this is a partial write. */
    if (n >= 0) {
      req->send_handle = NULL;
      if (uv__write_req_update(stream, req, n)) {
        uv__write_req_finish(req);
        if (count-- > 0)
          continue; /* Start trying to write the next request. */

        return;
      }
    } else if (n != UV_EAGAIN)
      goto error;

    /* If this is a blocking stream, try again. */
    if (stream->flags & UV_HANDLE_BLOCKING_WRITES)
      continue;

    /* We're not done. */
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);

    /* Notify select() thread about state change */
    uv__stream_osx_interrupt_select(stream);

    return;
  }

error:
  req->error = n;
  uv__write_req_finish(req);
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);
}